

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O3

void __thiscall ExecutionEngine::i_fstore_0(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value variableValue;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  variableValue = Frame::popTopOfOperandStack(this_01);
  if (variableValue.type == FLOAT) {
    Frame::changeLocalVariable(this_01,variableValue,0);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value.type == ValueType::FLOAT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x572,"void ExecutionEngine::i_fstore_0()");
}

Assistant:

void ExecutionEngine::i_fstore_0() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value = topFrame->popTopOfOperandStack();
    assert(value.type == ValueType::FLOAT);
    topFrame->changeLocalVariable(value, 0);

    topFrame->pc += 1;
}